

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.cpp
# Opt level: O1

void __thiscall Emulator::update_screen(Emulator *this)

{
  int i;
  ulong uVar1;
  uint32_t pixels [2048];
  uint local_2008 [2048];
  
  if (this->should_draw == true) {
    uVar1 = 0;
    do {
      local_2008[uVar1] =
           -(uint)(((this->framebuf).super__Base_bitset<32UL>._M_w[uVar1 >> 6] >> (uVar1 & 0x3f) & 1
                   ) != 0) | 0xff000000;
      uVar1 = uVar1 + 1;
    } while (uVar1 != 0x800);
    SDL_UpdateTexture((this->sdl).texture,0,local_2008,0x100);
    SDL_RenderCopy((this->sdl).renderer,(this->sdl).texture,0,0);
    SDL_RenderPresent((this->sdl).renderer);
    this->should_draw = false;
  }
  return;
}

Assistant:

void Emulator::update_screen(){
	// Update screen only when needed
	if (!should_draw)
		return;

	// Get the pixels from the framebuf
	uint32_t pixels[FRAMEBUF_H*FRAMEBUF_W];
	for (int i = 0; i < FRAMEBUF_H*FRAMEBUF_W; i++)
		pixels[i] = (framebuf[i] ? 0xFFFFFFFF : 0xFF000000);
	
	// Draw pixels
	SDL_UpdateTexture(sdl.texture, NULL, pixels, FRAMEBUF_W*sizeof(uint32_t));
	//SDL_RenderClear(sdl.renderer);
	SDL_RenderCopy(sdl.renderer, sdl.texture, NULL, NULL);
	SDL_RenderPresent(sdl.renderer);
	
	// Update flag
	should_draw = false;
}